

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O0

void __thiscall
supermap::
SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>,unsigned_int,void,supermap::Key<2ul>>
::find(SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>,unsigned_int,void,supermap::Key<2ul>>
       *this)

{
  function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>_&,_const_supermap::Key<2UL>_&)>
  *in_stack_00000060;
  function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>_&,_const_supermap::Key<2UL>_&)>
  *in_stack_00000068;
  Key<2UL> *in_stack_00000070;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int,_void,_supermap::Key<2UL>_>
  *in_stack_00000078;
  
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int,_void,_supermap::Key<2UL>_>
  ::find(in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000060);
  return;
}

Assistant:

std::optional<T> find(
        const FindPattern &pattern,
        std::function<bool(const T &, const FindPattern &)> less,
        std::function<bool(const T &, const FindPattern &)> equal
    ) override {
        if (getItemsCount() == 0) {
            return std::nullopt;
        }
        IndexT firstLeq = 0;
        IndexT lastGt = getItemsCount();
        while (lastGt - firstLeq > 1) {
            IndexT middle = (firstLeq + lastGt) / 2;
            T middleElem = get(middle);
            if (less(middleElem, pattern) || equal(middleElem, pattern)) {
                firstLeq = middle;
            } else {
                lastGt = middle;
            }
        }
        if (firstLeq >= getItemsCount()) {
            return std::nullopt;
        }
        T firstLeqElem = get(firstLeq);
        return equal(firstLeqElem, pattern) ? std::optional{firstLeqElem} : std::nullopt;
    }